

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void ParseGen(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  undefined8 uVar4;
  ulong uVar5;
  uint local_38;
  int i;
  int numgens;
  SFGenList *gen;
  SFGenList *gens;
  DWORD chunklen_local;
  DWORD chunkid_local;
  FileReader *f_local;
  SFFile *sf2_local;
  
  if ((chunklen & 3) != 0) {
    uVar4 = __cxa_allocate_exception(1);
    __cxa_throw(uVar4,&CBadForm::typeinfo,0);
  }
  local_38 = chunklen >> 2;
  if (chunkid == 0x6e656770) {
    if (local_38 != sf2->PresetBags[sf2->NumPresetBags + -1].GenIndex + 1) {
      uVar4 = __cxa_allocate_exception(1);
      __cxa_throw(uVar4,&CBadForm::typeinfo,0);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(int)local_38;
    uVar5 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    gen = (SFGenList *)operator_new__(uVar5);
    sf2->PresetGenerators = gen;
    sf2->NumPresetGenerators = local_38;
  }
  else {
    if (chunkid != 0x6e656769) {
      __assert_fail("chunkid == ID_igen",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/timidity/instrum_sf2.cpp"
                    ,0x241,"void ParseGen(SFFile *, FileReader *, DWORD, DWORD)");
    }
    if (local_38 != sf2->InstrBags[sf2->NumInstrBags + -1].GenIndex + 1) {
      uVar4 = __cxa_allocate_exception(1);
      __cxa_throw(uVar4,&CBadForm::typeinfo,0);
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(int)local_38;
    uVar5 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    gen = (SFGenList *)operator_new__(uVar5);
    sf2->InstrGenerators = gen;
    sf2->NumInstrGenerators = local_38;
  }
  _i = gen;
  for (; local_38 != 0; local_38 = local_38 - 1) {
    iVar3 = read_uword(f);
    _i->Oper = (SFGenerator)iVar3;
    iVar3 = read_uword(f);
    (_i->field_1).Amount = (SWORD)iVar3;
    _i = _i + 1;
  }
  return;
}

Assistant:

static void ParseGen(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	SFGenList *gens, *gen;
	int numgens;
	int i;

	// Section 7.5, page 24:
	//		If the PGEN sub-chunk is missing, or its size is not a multiple of
	//		four bytes, the file should be rejected as structurally unsound.
	if (chunklen & 3)
	{
		throw CBadForm();
	}
	numgens = chunklen >> 2;

	if (chunkid == ID_pgen)
	{
		// Section 7.3, page 22:
		//		the size of the PGEN sub-chunk in bytes will be equal to four
		//		times the terminal preset�s wGenNdx plus four.
		if (numgens != sf2->PresetBags[sf2->NumPresetBags - 1].GenIndex + 1)
		{
			throw CBadForm();
		}
		sf2->PresetGenerators = gens = new SFGenList[numgens];
		sf2->NumPresetGenerators = numgens;
	}
	else
	{
		assert(chunkid == ID_igen);
		if (numgens != sf2->InstrBags[sf2->NumInstrBags - 1].GenIndex + 1)
		{
			throw CBadForm();
		}
		sf2->InstrGenerators = gens = new SFGenList[numgens];
		sf2->NumInstrGenerators = numgens;
	}
	
	for (i = numgens, gen = gens; i != 0; --i, ++gen)
	{
		gen->Oper = read_uword(f);
		gen->uAmount = read_uword(f);
#ifdef __BIG_ENDIAN__
		if (gen->Oper == GEN_keyRange || gen->Oper == GEN_velRange)
		{
			// Reswap range generators
			gen->uAmount = LittleShort(gen->uAmount);
		}
#endif
	}
}